

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void __thiscall
mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>::
ConditionalConstraint
          (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_> *this,
          Arguments *args)

{
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> local_b0;
  
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::AlgebraicConstraint(&local_b0,args);
  CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>_>
  ::CustomFunctionalConstraint
            (&this->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>_>
             ,&local_b0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::~AlgebraicConstraint(&local_b0);
  return;
}

Assistant:

ConditionalConstraint(Arguments args) noexcept :
    Base(std::move(args)) { }